

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void codeApplyAffinity(Parse *pParse,int base,int n,char *zAff)

{
  Vdbe *p;
  bool bVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  uint p2;
  char *pcVar7;
  
  if (zAff != (char *)0x0) {
    if (0 < n) {
      pcVar7 = zAff + (uint)n;
      iVar4 = n + base;
      do {
        if (*zAff != 'A') goto LAB_0018f448;
        base = base + 1;
        zAff = zAff + 1;
        bVar1 = 1 < n;
        n = n - 1;
      } while (bVar1);
      n = 0;
      zAff = pcVar7;
      base = iVar4;
    }
LAB_0018f448:
    p = pParse->pVdbe;
    uVar5 = (ulong)(uint)n;
    uVar3 = 1;
    if (n < 1) {
      uVar3 = n;
    }
    uVar6 = n + 1;
    do {
      p2 = uVar3;
      if ((int)uVar5 < 2) break;
      uVar6 = uVar6 - 1;
      lVar2 = uVar5 - 1;
      uVar5 = uVar5 - 1;
      p2 = uVar6;
    } while (zAff[lVar2] == 'A');
    if (0 < (int)p2) {
      iVar4 = sqlite3VdbeAddOp3(p,0x5b,base,p2,0);
      sqlite3VdbeChangeP4(p,iVar4,zAff,p2);
      return;
    }
  }
  return;
}

Assistant:

static void codeApplyAffinity(Parse *pParse, int base, int n, char *zAff){
  Vdbe *v = pParse->pVdbe;
  if( zAff==0 ){
    assert( pParse->db->mallocFailed );
    return;
  }
  assert( v!=0 );

  /* Adjust base and n to skip over SQLITE_AFF_BLOB entries at the beginning
  ** and end of the affinity string.
  */
  while( n>0 && zAff[0]==SQLITE_AFF_BLOB ){
    n--;
    base++;
    zAff++;
  }
  while( n>1 && zAff[n-1]==SQLITE_AFF_BLOB ){
    n--;
  }

  /* Code the OP_Affinity opcode if there is anything left to do. */
  if( n>0 ){
    sqlite3VdbeAddOp4(v, OP_Affinity, base, n, 0, zAff, n);
  }
}